

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::reporters::Reporter_testInMemoryReporter_Test::TestBody
          (Reporter_testInMemoryReporter_Test *this)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  int kNumReports;
  InMemoryReporter reporter;
  int local_88;
  undefined4 uStack_84;
  int local_80 [2];
  internal local_78 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  int local_64;
  InMemoryReporter local_60;
  
  InMemoryReporter::InMemoryReporter(&local_60);
  local_64 = 100;
  iVar2 = 100;
  do {
    InMemoryReporter::report(&local_60,(Span *)(anonymous_namespace)::span);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  local_88 = InMemoryReporter::spansSubmitted(&local_60);
  testing::internal::CmpHelperEQ<int,int>
            (local_78,"kNumReports","reporter.spansSubmitted()",&local_64,&local_88);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/reporters/ReporterTest.cpp"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if (CONCAT44(uStack_84,local_88) != 0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)CONCAT44(uStack_84,local_88) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(uStack_84,local_88) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    InMemoryReporter::reset(&local_60);
    local_88 = 0;
    local_80[0] = InMemoryReporter::spansSubmitted(&local_60);
    testing::internal::CmpHelperEQ<int,int>
              (local_78,"0","reporter.spansSubmitted()",&local_88,local_80);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_70.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/reporters/ReporterTest.cpp"
                 ,0x72,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
      if (CONCAT44(uStack_84,local_88) != 0) {
        cVar1 = testing::internal::IsTrue(true);
        if ((cVar1 != '\0') && ((long *)CONCAT44(uStack_84,local_88) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(uStack_84,local_88) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  local_60.super_Reporter._vptr_Reporter = (_func_int **)&PTR__InMemoryReporter_0020d740;
  std::vector<jaegertracing::Span,_std::allocator<jaegertracing::Span>_>::~vector(&local_60._spans);
  return;
}

Assistant:

TEST(Reporter, testInMemoryReporter)
{
    InMemoryReporter reporter;
    constexpr auto kNumReports = 100;
    for (auto i = 0; i < kNumReports; ++i) {
        reporter.report(span);
    }
    ASSERT_EQ(kNumReports, reporter.spansSubmitted());
    reporter.reset();
    ASSERT_EQ(0, reporter.spansSubmitted());
    reporter.close();
}